

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

void idct_block(uint8 *out,int out_stride,short *data,uint8 *dequantize)

{
  long lVar1;
  int iVar2;
  uint8 uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int aiStack_154 [3];
  undefined8 local_148;
  int aiStack_140 [18];
  int aiStack_f8 [8];
  int local_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  lVar1 = 0;
  do {
    if ((int)lVar1 == 8) {
      local_148 = out + 7;
      for (lVar1 = 0x1c; (int)lVar1 != 0x11c; lVar1 = lVar1 + 0x20) {
        iVar2 = *(int *)((long)aiStack_154 + lVar1 + 8);
        iVar10 = *(int *)((long)aiStack_140 + lVar1 + 4);
        iVar16 = (iVar10 + iVar2) * 0x8a9;
        iVar12 = iVar10 * -0x1d8f + iVar16;
        iVar16 = iVar2 * 0xc3f + iVar16;
        iVar2 = *(int *)((long)aiStack_140 + lVar1 + -4);
        iVar10 = *(int *)((long)aiStack_154 + lVar1 + 4);
        iVar5 = *(int *)((long)aiStack_140 + lVar1 + 8);
        iVar8 = *(int *)((long)aiStack_140 + lVar1);
        iVar6 = *(int *)((long)aiStack_140 + lVar1 + -8);
        iVar11 = (iVar10 + iVar8 + iVar6 + iVar5) * 0x12d0;
        iVar9 = (iVar10 + iVar5) * -0xe65 + iVar11;
        iVar11 = (iVar6 + iVar8) * -0x2901 + iVar11;
        iVar13 = (iVar10 + iVar8) * -0x63d;
        iVar14 = (iVar6 + iVar5) * -0x1f62;
        iVar15 = iVar6 * 0x312a + iVar14 + iVar11;
        iVar11 = iVar8 * 0x20da + iVar13 + iVar11;
        iVar8 = (iVar2 + *(int *)((long)aiStack_154 + lVar1)) * 0x1000;
        iVar2 = (*(int *)((long)aiStack_154 + lVar1) - iVar2) * 0x1000;
        iVar6 = iVar8 - iVar16;
        iVar13 = iVar10 * 0x1805 + iVar13 + iVar9;
        iVar9 = iVar5 * 0x4c7 + iVar14 + iVar9;
        iVar10 = iVar2 - iVar12;
        iVar16 = iVar8 + 0x10000 + iVar16;
        iVar12 = iVar2 + 0x10000 + iVar12;
        iVar2 = iVar13 + iVar16 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        iVar2 = iVar16 - iVar13 >> 0x11;
        uVar7 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar7 = (char)iVar2 + 0x80;
        }
        local_148[-7] = uVar3;
        *local_148 = uVar7;
        iVar2 = iVar15 + iVar12 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        local_148[-6] = uVar3;
        iVar2 = iVar12 - iVar15 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        local_148[-1] = uVar3;
        iVar2 = iVar10 + iVar11 + 0x10000 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        local_148[-5] = uVar3;
        iVar2 = (iVar10 + 0x10000) - iVar11 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        local_148[-2] = uVar3;
        iVar2 = iVar6 + iVar9 + 0x10000 >> 0x11;
        uVar3 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar3 = (char)iVar2 + 0x80;
        }
        iVar2 = (iVar6 + 0x10000) - iVar9 >> 0x11;
        uVar7 = -(-0x81 < iVar2);
        if ((char)iVar2 == iVar2) {
          uVar7 = (char)iVar2 + 0x80;
        }
        local_148[-4] = uVar3;
        local_148[-3] = uVar7;
        local_148 = local_148 + out_stride;
      }
      return;
    }
    sVar4 = data[lVar1 + 0x10];
    if (sVar4 == 0 && data[lVar1 + 8] == 0) {
      if ((((data[lVar1 + 0x18] != 0) || (data[lVar1 + 0x20] != 0)) || (data[lVar1 + 0x28] != 0)) ||
         ((data[lVar1 + 0x30] != 0 || (data[lVar1 + 0x38] != 0)))) {
        sVar4 = 0;
        goto LAB_0014ed1c;
      }
      iVar2 = (uint)dequantize[lVar1] * (int)data[lVar1] * 4;
      aiStack_58[lVar1] = iVar2;
      aiStack_78[lVar1] = iVar2;
      aiStack_98[lVar1] = iVar2;
      aiStack_b8[lVar1] = iVar2;
      local_d8[lVar1] = iVar2;
      aiStack_f8[lVar1] = iVar2;
      aiStack_140[lVar1 + 10] = iVar2;
      aiStack_140[lVar1 + 2] = iVar2;
    }
    else {
LAB_0014ed1c:
      iVar5 = ((uint)dequantize[lVar1 + 0x30] * (int)data[lVar1 + 0x30] +
              (uint)dequantize[lVar1 + 0x10] * (int)sVar4) * 0x8a9;
      iVar2 = (uint)dequantize[lVar1 + 0x30] * (int)data[lVar1 + 0x30] * -0x1d8f + iVar5;
      iVar5 = (uint)dequantize[lVar1 + 0x10] * (int)sVar4 * 0xc3f + iVar5;
      iVar14 = (uint)dequantize[lVar1 + 0x38] * (int)data[lVar1 + 0x38];
      iVar11 = (uint)dequantize[lVar1 + 0x28] * (int)data[lVar1 + 0x28];
      iVar16 = (uint)dequantize[lVar1 + 0x18] * (int)data[lVar1 + 0x18];
      iVar12 = (uint)dequantize[lVar1 + 8] * (int)data[lVar1 + 8];
      iVar10 = (iVar11 + iVar12 + iVar16 + iVar14) * 0x12d0;
      iVar6 = (iVar14 + iVar12) * -0xe65 + iVar10;
      iVar10 = (iVar16 + iVar11) * -0x2901 + iVar10;
      iVar8 = (iVar11 + iVar12) * -0x63d;
      iVar9 = (iVar16 + iVar14) * -0x1f62;
      iVar13 = iVar16 * 0x312a + iVar9 + iVar10;
      iVar10 = iVar11 * 0x20da + iVar8 + iVar10;
      iVar16 = ((uint)dequantize[lVar1 + 0x20] * (int)data[lVar1 + 0x20] +
               (uint)dequantize[lVar1] * (int)data[lVar1]) * 0x1000;
      iVar11 = ((uint)dequantize[lVar1] * (int)data[lVar1] -
               (uint)dequantize[lVar1 + 0x20] * (int)data[lVar1 + 0x20]) * 0x1000;
      iVar12 = iVar12 * 0x1805 + iVar8 + iVar6;
      iVar6 = iVar14 * 0x4c7 + iVar9 + iVar6;
      iVar9 = iVar16 - iVar5;
      iVar5 = iVar16 + 0x200 + iVar5;
      iVar8 = iVar11 - iVar2;
      iVar2 = iVar11 + 0x200 + iVar2;
      aiStack_140[lVar1 + 2] = iVar12 + iVar5 >> 10;
      aiStack_58[lVar1] = iVar5 - iVar12 >> 10;
      aiStack_140[lVar1 + 10] = iVar2 + iVar13 >> 10;
      aiStack_78[lVar1] = iVar2 - iVar13 >> 10;
      aiStack_f8[lVar1] = iVar10 + iVar8 + 0x200 >> 10;
      aiStack_98[lVar1] = (iVar8 + 0x200) - iVar10 >> 10;
      local_d8[lVar1] = iVar9 + iVar6 + 0x200 >> 10;
      aiStack_b8[lVar1] = (iVar9 + 0x200) - iVar6 >> 10;
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void idct_block(uint8 *out, int out_stride, short data[64], uint8 *dequantize)
{
   int i,val[64],*v=val;
   uint8 *o,*dq = dequantize;
   short *d = data;

   // columns
   for (i=0; i < 8; ++i,++d,++dq, ++v) {
      // if all zeroes, shortcut -- this avoids dequantizing 0s and IDCTing
      if (d[ 8]==0 && d[16]==0 && d[24]==0 && d[32]==0
           && d[40]==0 && d[48]==0 && d[56]==0) {
         //    no shortcut                 0     seconds
         //    (1|2|3|4|5|6|7)==0          0     seconds
         //    all separate               -0.047 seconds
         //    1 && 2|3 && 4|5 && 6|7:    -0.047 seconds
         int dcterm = d[0] * dq[0] << 2;
         v[0] = v[8] = v[16] = v[24] = v[32] = v[40] = v[48] = v[56] = dcterm;
      } else {
         IDCT_1D(d[ 0]*dq[ 0],d[ 8]*dq[ 8],d[16]*dq[16],d[24]*dq[24],
                 d[32]*dq[32],d[40]*dq[40],d[48]*dq[48],d[56]*dq[56])
         // constants scaled things up by 1<<12; let's bring them back
         // down, but keep 2 extra bits of precision
         x0 += 512; x1 += 512; x2 += 512; x3 += 512;
         v[ 0] = (x0+t3) >> 10;
         v[56] = (x0-t3) >> 10;
         v[ 8] = (x1+t2) >> 10;
         v[48] = (x1-t2) >> 10;
         v[16] = (x2+t1) >> 10;
         v[40] = (x2-t1) >> 10;
         v[24] = (x3+t0) >> 10;
         v[32] = (x3-t0) >> 10;
      }
   }

   for (i=0, v=val, o=out; i < 8; ++i,v+=8,o+=out_stride) {
      // no fast case since the first 1D IDCT spread components out
      IDCT_1D(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7])
      // constants scaled things up by 1<<12, plus we had 1<<2 from first
      // loop, plus horizontal and vertical each scale by sqrt(8) so together
      // we've got an extra 1<<3, so 1<<17 total we need to remove.
      x0 += 65536; x1 += 65536; x2 += 65536; x3 += 65536;
      o[0] = clamp((x0+t3) >> 17);
      o[7] = clamp((x0-t3) >> 17);
      o[1] = clamp((x1+t2) >> 17);
      o[6] = clamp((x1-t2) >> 17);
      o[2] = clamp((x2+t1) >> 17);
      o[5] = clamp((x2-t1) >> 17);
      o[3] = clamp((x3+t0) >> 17);
      o[4] = clamp((x3-t0) >> 17);
   }
}